

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

FPolyObj * __thiscall FPolyMirrorIterator::NextMirror(FPolyMirrorIterator *this)

{
  uint uVar1;
  uint uVar2;
  FPolyObj *pFVar3;
  ulong uVar4;
  long lVar5;
  FPolyObj *pFVar6;
  
  pFVar3 = this->CurPoly;
  if (pFVar3 == (FPolyObj *)0x0) {
    return (FPolyObj *)0x0;
  }
  uVar1 = pFVar3->MirrorNum;
  if (uVar1 != 0) {
    uVar2 = this->NumUsedPolys;
    uVar4 = 0;
    if ((ulong)uVar2 != 100) {
      if (0 < (int)uVar2) {
        uVar4 = 0;
        do {
          if (this->UsedPolys[uVar4] == uVar1) goto LAB_0055f80e;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
        uVar4 = (ulong)uVar2;
      }
LAB_0055f80e:
      if ((uint)uVar4 == uVar2) {
        this->NumUsedPolys = uVar2 + 1;
        this->UsedPolys[(int)uVar2] = uVar1;
        lVar5 = (long)po_NumPolyobjs;
        pFVar6 = polyobjs;
        if (0 < lVar5) {
          do {
            if (pFVar6->tag == uVar1) goto LAB_0055f84e;
            lVar5 = lVar5 + -1;
            pFVar6 = pFVar6 + 1;
          } while (lVar5 != 0);
        }
        pFVar6 = (FPolyObj *)0x0;
LAB_0055f84e:
        if (pFVar6 == (FPolyObj *)0x0) {
          pFVar6 = (FPolyObj *)0x0;
          Printf("Invalid mirror polyobj num %d for polyobj num %d\n",(ulong)uVar1,
                 (ulong)(uint)this->UsedPolys[(long)(int)(uint)uVar4 + -1]);
        }
        goto LAB_0055f870;
      }
    }
  }
  pFVar6 = (FPolyObj *)0x0;
LAB_0055f870:
  this->CurPoly = pFVar6;
  return pFVar3;
}

Assistant:

FPolyObj *FPolyMirrorIterator::NextMirror()
{
	FPolyObj *poly = CurPoly, *nextpoly;

	if (poly == NULL)
	{
		return NULL;
	}

	// Do the work to decide which polyobject to return the next time this
	// function is called.
	int mirror = poly->GetMirror(), i;
	nextpoly = NULL;

	// Is there a mirror and we have room to remember it?
	if (mirror != 0 && NumUsedPolys != countof(UsedPolys))
	{
		// Has this polyobject been returned already?
		for (i = 0; i < NumUsedPolys; ++i)
		{
			if (UsedPolys[i] == mirror)
			{
				break;	// Yes, it has been returned.
			}
		}
		if (i == NumUsedPolys)
		{ // No, it has not been returned.
			UsedPolys[NumUsedPolys++] = mirror;
			nextpoly = PO_GetPolyobj(mirror);
			if (nextpoly == NULL)
			{
				Printf("Invalid mirror polyobj num %d for polyobj num %d\n", mirror, UsedPolys[i - 1]);
			}
		}
	}
	CurPoly = nextpoly;
	return poly;
}